

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O3

int Dch_ClassesRefineOneClass(Dch_Cla_t *p,Aig_Obj_t *pReprOld,int fRecursive)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t **ppAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t **ppAVar6;
  int iVar7;
  int iVar8;
  void **ppvVar9;
  long lVar10;
  Vec_Ptr_t *pVVar11;
  Aig_Obj_t *pAVar12;
  Vec_Ptr_t *pVVar13;
  long lVar14;
  bool bVar15;
  int *local_48;
  
  pVVar13 = p->vClassNew;
  iVar8 = 0;
  p->vClassOld->nSize = 0;
  pVVar13->nSize = 0;
  lVar14 = (long)pReprOld->Id;
  if (0 < p->pClassSizes[lVar14]) {
    local_48 = &pReprOld->Id;
    bVar15 = fRecursive == 0;
    iVar8 = 0;
    do {
      lVar10 = 0;
      do {
        pAVar3 = p->pId2Class[lVar14][lVar10];
        if (pAVar3 != (Aig_Obj_t *)0x0) {
          iVar7 = (*p->pFuncNodesAreEqual)(p->pManData,pReprOld,pAVar3);
          if (iVar7 == 0) {
            pVVar13 = p->vClassNew;
          }
          else {
            pVVar13 = p->vClassOld;
          }
          uVar1 = pVVar13->nSize;
          if (uVar1 == pVVar13->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar13->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc(0x80);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar13->pArray,0x80);
              }
              pVVar13->pArray = ppvVar9;
              pVVar13->nCap = 0x10;
            }
            else {
              if (pVVar13->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar13->pArray,(ulong)uVar1 << 4);
              }
              pVVar13->pArray = ppvVar9;
              pVVar13->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar9 = pVVar13->pArray;
          }
          iVar7 = pVVar13->nSize;
          pVVar13->nSize = iVar7 + 1;
          ppvVar9[iVar7] = pAVar3;
        }
        lVar10 = lVar10 + 1;
        lVar14 = (long)*local_48;
      } while (lVar10 < p->pClassSizes[lVar14]);
      iVar7 = p->vClassNew->nSize;
      if (iVar7 == 0) {
        iVar7 = 0;
        break;
      }
      if (iVar7 < 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (p->vClassOld->nSize < 1) {
        __assert_fail("Vec_PtrSize(p->vClassOld) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                      ,0x1cf,"int Dch_ClassesRefineOneClass(Dch_Cla_t *, Aig_Obj_t *, int)");
      }
      ppAVar4 = p->pId2Class[lVar14];
      if (ppAVar4 == (Aig_Obj_t **)0x0) {
        __assert_fail("pClass != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                      ,0x74,"Aig_Obj_t **Dch_ObjRemoveClass(Dch_Cla_t *, Aig_Obj_t *)");
      }
      pAVar3 = (Aig_Obj_t *)*p->vClassNew->pArray;
      p->pId2Class[lVar14] = (Aig_Obj_t **)0x0;
      iVar7 = p->pClassSizes[lVar14];
      if (iVar7 < 2) {
        __assert_fail("nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                      ,0x77,"Aig_Obj_t **Dch_ObjRemoveClass(Dch_Cla_t *, Aig_Obj_t *)");
      }
      p->nClasses = p->nClasses + -1;
      p->nLits = (p->nLits - iVar7) + 1;
      p->pClassSizes[lVar14] = 0;
      pVVar13 = p->vClassOld;
      if (pVVar13->nSize < 1) {
        lVar14 = 0;
      }
      else {
        lVar14 = 0;
        do {
          pAVar5 = (Aig_Obj_t *)pVVar13->pArray[lVar14];
          ppAVar4[lVar14] = pAVar5;
          ppAVar6 = p->pAig->pReprs;
          if (ppAVar6 == (Aig_Obj_t **)0x0) goto LAB_00908bdd;
          pAVar12 = pReprOld;
          if (lVar14 == 0) {
            pAVar12 = (Aig_Obj_t *)0x0;
          }
          ppAVar6[pAVar5->Id] = pAVar12;
          lVar14 = lVar14 + 1;
          pVVar13 = p->vClassOld;
        } while (lVar14 < pVVar13->nSize);
      }
      pVVar11 = p->vClassNew;
      if (0 < pVVar11->nSize) {
        lVar10 = 0;
        do {
          pAVar5 = (Aig_Obj_t *)pVVar11->pArray[lVar10];
          (ppAVar4 + lVar14)[lVar10] = pAVar5;
          ppAVar6 = p->pAig->pReprs;
          if (ppAVar6 == (Aig_Obj_t **)0x0) {
LAB_00908bdd:
            __assert_fail("p->pReprs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          pAVar12 = pAVar3;
          if (lVar10 == 0) {
            pAVar12 = (Aig_Obj_t *)0x0;
          }
          ppAVar6[pAVar5->Id] = pAVar12;
          lVar10 = lVar10 + 1;
          pVVar11 = p->vClassNew;
        } while (lVar10 < pVVar11->nSize);
        pVVar13 = p->vClassOld;
      }
      iVar7 = pVVar13->nSize;
      if (1 < iVar7) {
        iVar2 = *local_48;
        if (p->pId2Class[iVar2] != (Aig_Obj_t **)0x0) goto LAB_00908c78;
        p->pId2Class[iVar2] = ppAVar4;
        if (p->pClassSizes[iVar2] != 0) goto LAB_00908c97;
        p->pClassSizes[iVar2] = iVar7;
        p->nClasses = p->nClasses + 1;
        p->nLits = p->nLits + iVar7 + -1;
        pVVar11 = p->vClassNew;
      }
      iVar7 = pVVar11->nSize;
      if (1 < iVar7) {
        iVar2 = pAVar3->Id;
        if (p->pId2Class[iVar2] != (Aig_Obj_t **)0x0) {
LAB_00908c78:
          __assert_fail("p->pId2Class[pRepr->Id] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                        ,0x5c,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
        }
        p->pId2Class[iVar2] = ppAVar4 + lVar14;
        if (p->pClassSizes[iVar2] != 0) {
LAB_00908c97:
          __assert_fail("p->pClassSizes[pRepr->Id] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                        ,0x5e,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
        }
        p->pClassSizes[iVar2] = iVar7;
        p->nClasses = p->nClasses + 1;
        p->nLits = iVar7 + p->nLits + -1;
      }
      if ((bVar15) || (pVVar13 = p->vClassNew, pVVar13->nSize < 2)) {
        iVar7 = 1;
        break;
      }
      iVar8 = iVar8 + 1;
      bVar15 = false;
      iVar7 = 0;
      p->vClassOld->nSize = 0;
      pVVar13->nSize = 0;
      local_48 = &pAVar3->Id;
      lVar14 = (long)pAVar3->Id;
      pReprOld = pAVar3;
    } while (0 < p->pClassSizes[lVar14]);
    iVar8 = iVar8 + iVar7;
  }
  return iVar8;
}

Assistant:

int Dch_ClassesRefineOneClass( Dch_Cla_t * p, Aig_Obj_t * pReprOld, int fRecursive )
{
    Aig_Obj_t ** pClassOld, ** pClassNew;
    Aig_Obj_t * pObj, * pReprNew;
    int i;

    // split the class
    Vec_PtrClear( p->vClassOld );
    Vec_PtrClear( p->vClassNew );
    Dch_ClassForEachNode( p, pReprOld, pObj, i )
        if ( p->pFuncNodesAreEqual(p->pManData, pReprOld, pObj) )
            Vec_PtrPush( p->vClassOld, pObj );
        else
            Vec_PtrPush( p->vClassNew, pObj );
    // check if splitting happened
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;

    // get the new representative
    pReprNew = (Aig_Obj_t *)Vec_PtrEntry( p->vClassNew, 0 );
    assert( Vec_PtrSize(p->vClassOld) > 0 );
    assert( Vec_PtrSize(p->vClassNew) > 0 );

    // create old class
    pClassOld = Dch_ObjRemoveClass( p, pReprOld );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassOld, pObj, i )
    {
        pClassOld[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprOld : NULL );
    }
    // create new class
    pClassNew = pClassOld + i;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        pClassNew[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprNew : NULL );
    }

    // put classes back
    if ( Vec_PtrSize(p->vClassOld) > 1 )
        Dch_ObjAddClass( p, pReprOld, pClassOld, Vec_PtrSize(p->vClassOld) );
    if ( Vec_PtrSize(p->vClassNew) > 1 )
        Dch_ObjAddClass( p, pReprNew, pClassNew, Vec_PtrSize(p->vClassNew) );

    // check if the class should be recursively refined
    if ( fRecursive && Vec_PtrSize(p->vClassNew) > 1 )
        return 1 + Dch_ClassesRefineOneClass( p, pReprNew, 1 );
    return 1;
}